

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O1

ostream * operator<<(ostream *stream,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *vector)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
  pbVar4 = (vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar4->_M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"}",1);
  return stream;
}

Assistant:

std::ostream& operator <<(std::ostream& stream, const std::vector<Type>& vector)
{
  stream << "{";
  for(Type value: vector)
    stream << value << " ";
  stream << "}";
  return stream;
}